

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O1

void __thiscall EventLoop::quit(EventLoop *this)

{
  pthread_t pVar1;
  pthread_t pVar2;
  
  this->el_quit = true;
  pVar1 = (this->el_tid)._M_thread;
  pVar2 = pthread_self();
  if (pVar1 == pVar2) {
    return;
  }
  evfd_wakeup(this);
  return;
}

Assistant:

void EventLoop::quit() {
    el_quit = true;
    if (!is_in_loop_thread()) {
        evfd_wakeup();
    }
}